

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_load_module(MIR_context_t ctx,MIR_module_t_conflict m)

{
  MIR_item_type_t MVar1;
  MIR_func_t pMVar2;
  MIR_insn_t_conflict pMVar3;
  MIR_lref_data_t pMVar4;
  VARR_MIR_module_t *pVVar5;
  bool bVar6;
  MIR_error_type_t MVar7;
  int iVar8;
  MIR_item_t_conflict item;
  MIR_item_t_conflict pMVar9;
  void *pvVar10;
  char *pcVar11;
  MIR_item_t_conflict pMVar12;
  MIR_module_t_conflict *__ptr;
  char *pcVar13;
  MIR_item_t pMVar14;
  MIR_item_t pMVar15;
  DLIST_MIR_insn_t *pDVar16;
  ulong uVar17;
  char *pcVar18;
  MIR_context_t ctx_00;
  DLIST_MIR_item_t *pDVar19;
  size_t sVar20;
  
  if (m == (MIR_module_t_conflict)0x0) {
LAB_00112b4c:
    __assert_fail("m != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x765,"void MIR_load_module(MIR_context_t, MIR_module_t)");
  }
  bVar6 = false;
  ctx_00 = ctx;
  pDVar19 = &m->items;
  while (pMVar12 = pDVar19->head, pMVar12 != (MIR_item_t_conflict)0x0) {
    MVar1 = pMVar12->item_type;
    if (MVar1 - MIR_data_item < 5) {
      if (MVar1 == MIR_lref_data_item) {
        bVar6 = true;
      }
      ctx_00 = ctx;
      pMVar9 = load_bss_data_section(ctx,pMVar12,0);
    }
    else {
      pMVar9 = pMVar12;
      if (MVar1 == MIR_func_item) {
        pvVar10 = pMVar12->addr;
        if (pvVar10 == (void *)0x0) {
          pvVar10 = _MIR_get_thunk(ctx);
          pMVar12->addr = pvVar10;
        }
        ctx_00 = ctx;
        _MIR_redirect_thunk(ctx,pvVar10,undefined_interface);
      }
    }
    if (pMVar12->export_p != '\0') {
      if (pMVar12->item_type - MIR_import_item < 3) {
        __assert_fail("first_item->item_type != MIR_export_item && first_item->item_type != MIR_import_item && first_item->item_type != MIR_forward_item"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x77b,"void MIR_load_module(MIR_context_t, MIR_module_t)");
      }
      pcVar11 = MIR_item_name(ctx_00,pMVar12);
      ctx_00 = ctx;
      iVar8 = setup_global(ctx,pcVar11,pMVar12->addr,pMVar12);
      if (((iVar8 != 0) && (pMVar9->item_type == MIR_func_item)) &&
         (ctx->func_redef_permission_p == 0)) {
        pcVar18 = "func %s is prohibited for redefinition";
        pcVar11 = ((pMVar9->u).func)->name;
        MVar7 = MIR_repeated_decl_error;
        goto LAB_00112b46;
      }
    }
    pDVar19 = (DLIST_MIR_item_t *)&(pMVar9->item_link).next;
  }
  if (bVar6) {
    pMVar12 = (m->items).head;
    for (pMVar14 = pMVar12; pMVar15 = pMVar12, pMVar14 != (MIR_item_t_conflict)0x0;
        pMVar14 = (pMVar14->item_link).next) {
      if (pMVar14->item_type == MIR_func_item) {
        pMVar2 = (pMVar14->u).func;
        pDVar16 = &pMVar2->insns;
        while (pMVar3 = pDVar16->head, pMVar3 != (MIR_insn_t_conflict)0x0) {
          if (*(int *)&pMVar3->field_0x18 == 0xb4) {
            pMVar3->data = pMVar2;
          }
          pDVar16 = (DLIST_MIR_insn_t *)&(pMVar3->insn_link).next;
        }
      }
    }
    for (; pMVar15 != (MIR_item_t_conflict)0x0; pMVar15 = (pMVar15->item_link).next) {
      if (pMVar15->item_type == MIR_lref_data_item) {
        pMVar4 = (pMVar15->u).lref_data;
        pvVar10 = pMVar4->label->data;
        if (pvVar10 == (void *)0x0) {
          pcVar13 = pMVar4->name;
          pcVar18 = "A label not from any function in lref %s";
        }
        else {
          if ((pMVar4->label2 == (MIR_label_t)0x0) || (pMVar4->label2->data == pvVar10)) {
            pMVar4->next = *(MIR_lref_data **)((long)pvVar10 + 0x80);
            *(MIR_lref_data_t *)((long)pvVar10 + 0x80) = pMVar4;
            goto LAB_00112a4a;
          }
          pcVar13 = pMVar4->name;
          pcVar18 = "Labels from different functions in lref %s";
        }
        pcVar11 = "";
        if (pcVar13 != (char *)0x0) {
          pcVar11 = pcVar13;
        }
        MVar7 = MIR_wrong_lref_error;
LAB_00112b46:
        (*ctx->error_func)(MVar7,pcVar18,pcVar11);
        goto LAB_00112b4c;
      }
LAB_00112a4a:
    }
    for (; pMVar12 != (MIR_item_t_conflict)0x0; pMVar12 = (pMVar12->item_link).next) {
      if (pMVar12->item_type == MIR_func_item) {
        pDVar16 = &((pMVar12->u).func)->insns;
        while (pMVar3 = pDVar16->head, pMVar3 != (MIR_insn_t_conflict)0x0) {
          if (*(int *)&pMVar3->field_0x18 == 0xb4) {
            pMVar3->data = (void *)0x0;
          }
          pDVar16 = (DLIST_MIR_insn_t *)&(pMVar3->insn_link).next;
        }
      }
    }
  }
  pVVar5 = ctx->modules_to_link;
  __ptr = pVVar5->varr;
  if (__ptr == (MIR_module_t_conflict *)0x0) {
    mir_varr_assert_fail("expand","MIR_module_t");
  }
  sVar20 = pVVar5->els_num;
  uVar17 = sVar20 + 1;
  if (pVVar5->size < uVar17) {
    sVar20 = (uVar17 >> 1) + uVar17;
    __ptr = (MIR_module_t_conflict *)realloc(__ptr,sVar20 * 8);
    pVVar5->varr = __ptr;
    pVVar5->size = sVar20;
    sVar20 = pVVar5->els_num;
    uVar17 = sVar20 + 1;
  }
  pVVar5->els_num = uVar17;
  __ptr[sVar20] = m;
  return;
}

Assistant:

void MIR_load_module (MIR_context_t ctx, MIR_module_t m) {
  int lref_p = FALSE;
  mir_assert (m != NULL);
  for (MIR_item_t item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    MIR_item_t first_item = item;

    if (item->item_type == MIR_bss_item || item->item_type == MIR_data_item
        || item->item_type == MIR_ref_data_item || item->item_type == MIR_lref_data_item
        || item->item_type == MIR_expr_data_item) {
      if (item->item_type == MIR_lref_data_item) lref_p = TRUE;
      item = load_bss_data_section (ctx, item, FALSE);
    } else if (item->item_type == MIR_func_item) {
      if (item->addr == NULL) {
        item->addr = _MIR_get_thunk (ctx);
#if defined(MIR_DEBUG)
        fprintf (stderr, "%016llx: %s\n", (unsigned long long) item->addr, item->u.func->name);
#endif
      }
      _MIR_redirect_thunk (ctx, item->addr, undefined_interface);
    }
    if (first_item->export_p) { /* update global item table */
      mir_assert (first_item->item_type != MIR_export_item
                  && first_item->item_type != MIR_import_item
                  && first_item->item_type != MIR_forward_item);
      if (setup_global (ctx, MIR_item_name (ctx, first_item), first_item->addr, first_item)
          && item->item_type == MIR_func_item
          && !func_redef_permission_p
#ifdef __APPLE__
          /* macosx can have multiple equal external inline definitions of the same function: */
          && strncmp (item->u.func->name, "__darwin", 8) != 0
#endif
      )
        MIR_get_error_func (ctx) (MIR_repeated_decl_error, "func %s is prohibited for redefinition",
                                  item->u.func->name);
    }
  }
  if (lref_p) link_module_lrefs (ctx, m);
  VARR_PUSH (MIR_module_t, modules_to_link, m);
}